

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O1

void __thiscall QHeaderView::initializeSections(QHeaderView *this,int start,int end)

{
  QHash<int,_int> *this_00;
  QList<int> *this_01;
  HeaderMode HVar1;
  ResizeMode mode;
  QHeaderViewPrivate *this_02;
  Span *pSVar2;
  int iVar3;
  Data<QHashPrivate::Node<int,_int>_> *pDVar4;
  Data *pDVar5;
  pointer piVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  ulong uVar10;
  int start_00;
  long lVar11;
  uint uVar12;
  long in_FS_OFFSET;
  piter it;
  undefined4 local_60;
  uint local_5c;
  void *local_58;
  uint *puStack_50;
  undefined4 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = *(QHeaderViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  (this_02->cachedSizeHint).wd = -1;
  (this_02->cachedSizeHint).ht = -1;
  HVar1 = this_02->headerMode;
  if (HVar1 == InitialNoSectionMemoryUsage) {
    uVar12 = (uint)this_02->countInNoSectionItemsMode;
  }
  else {
    uVar12 = (uint)(this_02->sectionItems).d.size;
  }
  start_00 = end + 1;
  if (HVar1 == InitialNoSectionMemoryUsage) {
    iVar3 = (int)this_02->countInNoSectionItemsMode;
  }
  else {
    iVar3 = (int)(this_02->sectionItems).d.size;
  }
  if (iVar3 <= start_00) goto LAB_005575bc;
  if (HVar1 == InitialNoSectionMemoryUsage) {
    iVar3 = (int)this_02->countInNoSectionItemsMode;
  }
  else {
    iVar3 = (int)(this_02->sectionItems).d.size;
  }
  QHeaderViewPrivate::removeSectionsFromSectionItems(this_02,start_00,iVar3 + -1);
  pDVar4 = (this_02->hiddenSectionSize).d;
  if ((pDVar4 == (Data<QHashPrivate::Node<int,_int>_> *)0x0) || (pDVar4->size == 0))
  goto LAB_005575bc;
  if (pDVar4 == (Data<QHashPrivate::Node<int,_int>_> *)0x0) {
    sVar9 = 0;
  }
  else {
    sVar9 = pDVar4->size;
  }
  this_00 = &this_02->hiddenSectionSize;
  if ((long)sVar9 < (long)(int)(uVar12 - start_00)) {
    iVar3 = start_00;
    while( true ) {
      local_58 = (void *)CONCAT44(local_58._4_4_,iVar3);
      if (this_02->headerMode == InitialNoSectionMemoryUsage) {
        iVar7 = (int)this_02->countInNoSectionItemsMode;
      }
      else {
        iVar7 = (int)(this_02->sectionItems).d.size;
      }
      if (iVar7 <= iVar3) break;
      QHash<int,_int>::removeImpl<int>(this_00,(int *)&local_58);
      iVar3 = (int)local_58 + 1;
    }
    goto LAB_005575bc;
  }
  if (pDVar4 == (Data<QHashPrivate::Node<int,_int>_> *)0x0) {
    pDVar5 = (Data *)0x0;
LAB_00557528:
    sVar9 = 0;
  }
  else {
    if (1 < (uint)(pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      pDVar4 = QHashPrivate::Data<QHashPrivate::Node<int,_int>_>::detached(pDVar4);
      this_00->d = pDVar4;
    }
    pDVar5 = this_00->d;
    if (pDVar5->spans->offsets[0] != 0xff) goto LAB_00557528;
    uVar10 = 1;
    do {
      sVar9 = uVar10;
      if (pDVar5->numBuckets == sVar9) {
        pDVar5 = (Data *)0x0;
        sVar9 = 0;
        break;
      }
      uVar10 = sVar9 + 1;
    } while (pDVar5->spans[sVar9 >> 7].offsets[(uint)sVar9 & 0x7f] == 0xff);
  }
  it.bucket = sVar9;
  it.d = pDVar5;
  if (pDVar5 != (Data *)0x0 || sVar9 != 0) {
    do {
      uVar10 = it.bucket;
      pDVar4 = it.d;
      pSVar2 = pDVar4->spans;
      if (end < *(int *)pSVar2[uVar10 >> 7].entries
                        [pSVar2[uVar10 >> 7].offsets[(uint)it.bucket & 0x7f]].storage.data) {
        it = (piter)QHash<int,_int>::erase(this_00,(const_iterator)it);
      }
      else {
        do {
          if (pDVar4->numBuckets - 1 == uVar10) {
            it = (piter)ZEXT816(0);
            break;
          }
          uVar10 = uVar10 + 1;
          it.bucket = uVar10;
          it.d = pDVar4;
        } while (pSVar2[uVar10 >> 7].offsets[(uint)uVar10 & 0x7f] == 0xff);
      }
    } while ((it.d != (Data<QHashPrivate::Node<int,_int>_> *)0x0) || (it.bucket != 0));
  }
LAB_005575bc:
  if ((this_02->logicalIndices).d.size != 0) {
    this_01 = &this_02->logicalIndices;
    if (start_00 < (int)uVar12) {
      if (0 < (int)uVar12) {
        uVar10 = 0;
        iVar3 = 0;
        do {
          iVar7 = (this_02->logicalIndices).d.ptr[uVar10];
          if (iVar7 <= end) {
            piVar6 = QList<int>::data(this_01);
            piVar6[iVar3] = iVar7;
            piVar6 = QList<int>::data(&this_02->visualIndices);
            piVar6[iVar7] = iVar3;
            iVar3 = iVar3 + 1;
          }
          uVar10 = uVar10 + 1;
        } while ((uVar12 & 0x7fffffff) != uVar10);
      }
      QList<int>::resize(this_01,(long)start_00);
      QList<int>::resize(&this_02->visualIndices,(long)start_00);
    }
    else {
      QList<int>::resize(this_01,(long)start_00);
      QList<int>::resize(&this_02->visualIndices,(long)start_00);
      if ((int)uVar12 <= end) {
        lVar11 = (long)(int)uVar12;
        do {
          piVar6 = QList<int>::data(this_01);
          piVar6[lVar11] = (int)lVar11;
          piVar6 = QList<int>::data(&this_02->visualIndices);
          piVar6[lVar11] = (int)lVar11;
          lVar11 = lVar11 + 1;
        } while (start_00 != (int)lVar11);
      }
    }
  }
  mode = this_02->globalResizeMode;
  if (mode == ResizeToContents) {
    this_02->contentsSections = start_00;
  }
  else if (mode == Stretch) {
    this_02->stretchSections = start_00;
  }
  if ((int)uVar12 <= end) {
    QHeaderViewPrivate::createSectionItems(this_02,start,end,this_02->defaultSectionSize,mode);
  }
  if (this_02->headerMode == InitialNoSectionMemoryUsage) {
    uVar8 = (uint)this_02->countInNoSectionItemsMode;
  }
  else {
    uVar8 = (uint)(this_02->sectionItems).d.size;
  }
  if (uVar8 != uVar12) {
    if (this_02->headerMode == InitialNoSectionMemoryUsage) {
      local_60 = (undefined4)this_02->countInNoSectionItemsMode;
    }
    else {
      local_60 = (undefined4)(this_02->sectionItems).d.size;
    }
    puStack_50 = &local_5c;
    local_48 = &local_60;
    local_58 = (void *)0x0;
    local_5c = uVar12;
    QMetaObject::activate((QObject *)this,&staticMetaObject,6,&local_58);
  }
  QWidget::update((this_02->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                  viewport);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderView::initializeSections(int start, int end)
{
    Q_D(QHeaderView);

    Q_ASSERT(start >= 0);
    Q_ASSERT(end >= 0);

    d->invalidateCachedSizeHint();
    int oldCount = d->sectionCount();

    if (end + 1 < d->sectionCount()) {
        int newCount = end + 1;
        d->removeSectionsFromSectionItems(newCount, d->sectionCount() - 1);
        if (!d->hiddenSectionSize.isEmpty()) {
            if (oldCount - newCount > d->hiddenSectionSize.size()) {
                for (int i = end + 1; i < d->sectionCount(); ++i)
                    d->hiddenSectionSize.remove(i);
            } else {
                QHash<int, int>::iterator it = d->hiddenSectionSize.begin();
                while (it != d->hiddenSectionSize.end()) {
                    if (it.key() > end)
                        it = d->hiddenSectionSize.erase(it);
                    else
                        ++it;
                }
            }
        }
    }

    int newSectionCount = end + 1;

    if (!d->logicalIndices.isEmpty()) {
        if (oldCount <= newSectionCount) {
            d->logicalIndices.resize(newSectionCount);
            d->visualIndices.resize(newSectionCount);
            for (int i = oldCount; i < newSectionCount; ++i) {
                d->logicalIndices[i] = i;
                d->visualIndices[i] = i;
            }
        } else {
            int j = 0;
            for (int i = 0; i < oldCount; ++i) {
                int v = d->logicalIndices.at(i);
                if (v < newSectionCount) {
                    d->logicalIndices[j] = v;
                    d->visualIndices[v] = j;
                    j++;
                }
            }
            d->logicalIndices.resize(newSectionCount);
            d->visualIndices.resize(newSectionCount);
        }
    }

    if (d->globalResizeMode == Stretch)
        d->stretchSections = newSectionCount;
    else if (d->globalResizeMode == ResizeToContents)
         d->contentsSections = newSectionCount;

    if (newSectionCount > oldCount)
        d->createSectionItems(start, end, d->defaultSectionSize, d->globalResizeMode);
    //Q_ASSERT(d->headerLength() == d->length);

    if (d->sectionCount() != oldCount)
        emit sectionCountChanged(oldCount,  d->sectionCount());
    d->viewport->update();
}